

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::Options
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,RegexFlags *flags)

{
  byte bVar1;
  RegexFlags RVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  RegexFlags RVar6;
  RegexFlags RVar7;
  
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (this->inputLim < this->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar4) {
LAB_00ee1e59:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    bVar1 = *this->next;
    if (bVar1 == 0) {
      return;
    }
    switch(bVar1 - 0x67 >> 1 | (uint)((bVar1 - 0x67 & 1) != 0) << 0x1f) {
    case 0:
      RVar7 = GlobalRegexFlag;
      RVar6 = GlobalRegexFlag;
      RVar2 = *flags & GlobalRegexFlag;
      break;
    case 1:
      RVar7 = IgnoreCaseRegexFlag;
      RVar6 = IgnoreCaseRegexFlag;
      RVar2 = *flags & IgnoreCaseRegexFlag;
      break;
    default:
      goto switchD_00ee1ce8_caseD_2;
    case 3:
      RVar7 = MultilineRegexFlag;
      RVar6 = MultilineRegexFlag;
      RVar2 = *flags & MultilineRegexFlag;
      break;
    case 6:
      if (((this->scriptContext->config).threadConfig)->m_ES2018RegExDotAll != true)
      goto switchD_00ee1ce8_caseD_7;
      RVar7 = DotAllRegexFlag;
      RVar6 = DotAllRegexFlag;
      RVar2 = *flags & DotAllRegexFlag;
      break;
    case 7:
switchD_00ee1ce8_caseD_7:
      if (((this->scriptContext->config).threadConfig)->m_ES6Unicode != true)
      goto switchD_00ee1ce8_caseD_9;
      RVar7 = UnicodeRegexFlag;
      RVar6 = UnicodeRegexFlag;
      RVar2 = *flags & UnicodeRegexFlag;
      break;
    case 9:
switchD_00ee1ce8_caseD_9:
      if (((this->scriptContext->config).threadConfig)->m_ES6RegExSticky != true) {
switchD_00ee1ce8_caseD_2:
        if ((ASCIIChars::classes[bVar1] & 1) == 0) {
          return;
        }
        Fail(this,-0x7ff5ec67);
        return;
      }
      RVar7 = StickyRegexFlag;
      RVar6 = StickyRegexFlag;
      RVar2 = *flags & StickyRegexFlag;
    }
    if (RVar2 != NoRegexFlags) {
      Fail(this,-0x7ff5ec67);
      RVar6 = RVar7;
    }
    *flags = *flags | RVar6;
    if (this->inputLim < this->next + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar4) goto LAB_00ee1e59;
      *puVar5 = 0;
    }
    if ((char)*this->next < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])"
                        );
      if (!bVar4) goto LAB_00ee1e59;
      *puVar5 = 0;
    }
    this->next = this->next + 1;
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::Options(RegexFlags& flags)
    {
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            CharCount consume;
            Char c;

            if (ec == 0)
                // Embedded 0 not valid
                return;
            else if (IsLiteral &&
                ec == '\\' &&
                ECCanConsume(6) &&
                ECLookahead(1) == 'u' &&
                standardEncodedChars->IsHex(ECLookahead(2)) &&
                standardEncodedChars->IsHex(ECLookahead(3)) &&
                standardEncodedChars->IsHex(ECLookahead(4)) &&
                standardEncodedChars->IsHex(ECLookahead(5)))
            {
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    Fail(JSERR_RegExpSyntax);
                    return;
                }
                else
                {
                    uint32 n = (standardEncodedChars->DigitValue(ECLookahead(2)) << 12) |
                               (standardEncodedChars->DigitValue(ECLookahead(3)) << 8) |
                               (standardEncodedChars->DigitValue(ECLookahead(4)) << 4) |
                               (standardEncodedChars->DigitValue(ECLookahead(5)));
                    c = UTC(n);
                    consume = 6;
                }
            }
            else
            {
                c = Chars<EncodedChar>::CTW(ec);
                consume = 1;
            }

            switch (c) {
            case 'i':
                if ((flags & IgnoreCaseRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & GlobalRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & MultilineRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & DotAllRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | DotAllRegexFlag);
                    break;
                }
            case 'u':
                // If we don't have unicode enabled, fall through to default
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if ((flags & UnicodeRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | UnicodeRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, UnicodeRegexFlag, scriptContext);

                    break;
                }
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & StickyRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | StickyRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, StickyRegexFlag, scriptContext);

                    break;
                }
            default:
                if (standardChars->IsWord(c))
                {
                    // Outer context could never parse this character. Signal the syntax error as
                    // being part of the regex.
                    Fail(JSERR_RegExpSyntax);
                }
                return;
            }

            ECConsume(consume);
        }
    }